

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::condition(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int maxiters,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *tolerance)

{
  int p_dim;
  type_conflict5 tVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  int iVar2;
  uint uVar3;
  long i;
  uint uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_418;
  double local_3d8;
  uint local_3cc;
  cpp_dec_float<50U,_int,_void> local_3c8;
  uint local_384;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_380;
  cpp_dec_float<50U,_int,_void> local_378;
  cpp_dec_float<50U,_int,_void> *local_338;
  cpp_dec_float<50U,_int,_void> *local_330;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_188;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_138;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  p_dim = (this->matrix).thesize;
  i = (long)p_dim;
  local_2e8.fpclass = cpp_dec_float_finite;
  local_2e8.prec_elem = 10;
  local_2e8.data._M_elems[0] = 0;
  local_2e8.data._M_elems[1] = 0;
  local_2e8.data._M_elems[2] = 0;
  local_2e8.data._M_elems[3] = 0;
  local_2e8.data._M_elems[4] = 0;
  local_2e8.data._M_elems[5] = 0;
  local_2e8.data._M_elems._24_5_ = 0;
  local_2e8.data._M_elems[7]._1_3_ = 0;
  local_2e8.data._M_elems._32_5_ = 0;
  local_2e8.data._M_elems[9]._1_3_ = 0;
  local_2e8.exp = 0;
  local_2e8.neg = false;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  local_418.fpclass = cpp_dec_float_finite;
  local_418.prec_elem = 10;
  local_418.data._M_elems[0] = 0;
  local_418.data._M_elems[1] = 0;
  local_418.data._M_elems[2] = 0;
  local_418.data._M_elems[3] = 0;
  local_418.data._M_elems[4] = 0;
  local_418.data._M_elems[5] = 0;
  local_418.data._M_elems[6] = 0;
  local_418.data._M_elems[7] = 0;
  local_418.data._M_elems._32_5_ = 0;
  local_418.data._M_elems[9]._1_3_ = 0;
  local_418.exp = 0;
  local_418.neg = false;
  local_378.fpclass = cpp_dec_float_finite;
  local_378.prec_elem = 10;
  local_378.data._M_elems[0] = 0;
  local_378.data._M_elems[1] = 0;
  local_378.data._M_elems[2] = 0;
  local_378.data._M_elems[3] = 0;
  local_378.data._M_elems[4] = 0;
  local_378.data._M_elems[5] = 0;
  local_378.data._M_elems[6] = 0;
  local_378.data._M_elems[7] = 0;
  local_378.data._M_elems._32_5_ = 0;
  local_378.data._M_elems[9]._1_3_ = 0;
  local_378.exp = 0;
  local_378.neg = false;
  local_338 = &__return_storage_ptr__->m_backend;
  local_330 = &tolerance->m_backend;
  if (i < 1) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&__return_storage_ptr__->m_backend,1.0,(type *)0x0);
  }
  else {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_298,
               &(this->theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_188,p_dim,(shared_ptr<soplex::Tolerances> *)&local_298);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_298._M_refcount);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2a8,
               &(this->theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_138,p_dim,(shared_ptr<soplex::Tolerances> *)&local_2a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
    if (this->thestatus < REGULAR) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (local_338,0,(type *)0x0);
    }
    else {
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])(this);
      }
      local_3d8 = 1.0;
      local_380 = this;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_328,i,(type *)0x0);
      local_3c8.fpclass = cpp_dec_float_finite;
      local_3c8.prec_elem = 10;
      local_3c8.data._M_elems[0] = 0;
      local_3c8.data._M_elems[1] = 0;
      local_3c8.data._M_elems[2] = 0;
      local_3c8.data._M_elems[3] = 0;
      local_3c8.data._M_elems[4] = 0;
      local_3c8.data._M_elems[5] = 0;
      local_3c8.data._M_elems._24_5_ = 0;
      local_3c8.data._M_elems[7]._1_3_ = 0;
      local_3c8.data._M_elems._32_5_ = 0;
      local_3c8.data._M_elems[9]._1_3_ = 0;
      local_3c8.exp = 0;
      local_3c8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                (&local_3c8,&local_3d8,&local_328);
      local_418.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
      local_418.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
      local_418.data._M_elems[4] = local_3c8.data._M_elems[4];
      local_418.data._M_elems[5] = local_3c8.data._M_elems[5];
      local_418.data._M_elems[6] = local_3c8.data._M_elems[6];
      local_418.data._M_elems[7] =
           (uint)(CONCAT35(local_3c8.data._M_elems[7]._1_3_,local_3c8.data._M_elems._24_5_) >> 0x20)
      ;
      local_418.data._M_elems[0] = local_3c8.data._M_elems[0];
      local_418.data._M_elems[1] = local_3c8.data._M_elems[1];
      local_418.data._M_elems[2] = local_3c8.data._M_elems[2];
      local_418.data._M_elems[3] = local_3c8.data._M_elems[3];
      local_418.exp = local_3c8.exp;
      local_418.neg = local_3c8.neg;
      local_418.fpclass = local_3c8.fpclass;
      local_418.prec_elem = local_3c8.prec_elem;
      for (iVar2 = 0; p_dim != iVar2; iVar2 = iVar2 + 1) {
        local_1c8.m_backend.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
        local_1c8.m_backend.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
        local_1c8.m_backend.data._M_elems[7] = local_418.data._M_elems[7];
        local_1c8.m_backend.data._M_elems[6] = local_418.data._M_elems[6];
        local_1c8.m_backend.data._M_elems[4] = local_418.data._M_elems[4];
        local_1c8.m_backend.data._M_elems[5] = local_418.data._M_elems[5];
        local_1c8.m_backend.data._M_elems[0] = local_418.data._M_elems[0];
        local_1c8.m_backend.data._M_elems[1] = local_418.data._M_elems[1];
        local_1c8.m_backend.data._M_elems[2] = local_418.data._M_elems[2];
        local_1c8.m_backend.data._M_elems[3] = local_418.data._M_elems[3];
        local_1c8.m_backend.exp = local_418.exp;
        local_1c8.m_backend.neg = local_418.neg;
        local_1c8.m_backend.fpclass = local_418.fpclass;
        local_1c8.m_backend.prec_elem = local_418.prec_elem;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_188,iVar2,&local_1c8);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_138,&local_188);
      uVar4 = 0;
      if (maxiters < 1) {
        maxiters = 0;
      }
      local_384 = maxiters;
      for (; local_384 != uVar4; uVar4 = uVar4 + 1) {
        local_378.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
        local_378.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
        local_378.data._M_elems[4] = local_418.data._M_elems[4];
        local_378.data._M_elems[5] = local_418.data._M_elems[5];
        local_378.data._M_elems[6] = local_418.data._M_elems[6];
        local_378.data._M_elems[7] = local_418.data._M_elems[7];
        local_378.data._M_elems[0] = local_418.data._M_elems[0];
        local_378.data._M_elems[1] = local_418.data._M_elems[1];
        local_378.data._M_elems[2] = local_418.data._M_elems[2];
        local_378.data._M_elems[3] = local_418.data._M_elems[3];
        local_378.exp = local_418.exp;
        local_378.neg = local_418.neg;
        local_378.fpclass = local_418.fpclass;
        local_378.prec_elem = local_418.prec_elem;
        multBaseWith(local_380,&local_188,&local_138);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_3c8,&local_138);
        local_418.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
        local_418.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
        local_418.data._M_elems[4] = local_3c8.data._M_elems[4];
        local_418.data._M_elems[5] = local_3c8.data._M_elems[5];
        local_418.data._M_elems[6] = local_3c8.data._M_elems[6];
        local_418.data._M_elems[7] =
             (uint)(CONCAT35(local_3c8.data._M_elems[7]._1_3_,local_3c8.data._M_elems._24_5_) >>
                   0x20);
        local_418.data._M_elems[0] = local_3c8.data._M_elems[0];
        local_418.data._M_elems[1] = local_3c8.data._M_elems[1];
        local_418.data._M_elems[2] = local_3c8.data._M_elems[2];
        local_418.data._M_elems[3] = local_3c8.data._M_elems[3];
        local_418.exp = local_3c8.exp;
        local_418.neg = local_3c8.neg;
        local_418.fpclass = local_3c8.fpclass;
        local_418.prec_elem = local_3c8.prec_elem;
        if (2 < uVar4) {
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8._37_8_ = 0;
          local_3cc = uVar4;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_a8,&local_418,&local_378);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&local_3c8,(multiprecision *)&local_a8,arg);
          local_328.fpclass = cpp_dec_float_finite;
          local_328.prec_elem = 10;
          local_328.data._M_elems[0] = 0;
          local_328.data._M_elems[1] = 0;
          local_328.data._M_elems[2] = 0;
          local_328.data._M_elems[3] = 0;
          local_328.data._M_elems[4] = 0;
          local_328.data._M_elems[5] = 0;
          local_328.data._M_elems._24_5_ = 0;
          local_328.data._M_elems[7]._1_3_ = 0;
          local_328.data._M_elems._32_5_ = 0;
          local_328._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_328,local_330,&local_418);
          tVar1 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3c8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_328);
          uVar4 = local_3cc;
          if (tVar1) break;
        }
        multWithBase(local_380,&local_138,&local_188);
        local_3d8 = 1.0;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_328,&local_188);
        local_3c8.fpclass = cpp_dec_float_finite;
        local_3c8.prec_elem = 10;
        local_3c8.data._M_elems[0] = 0;
        local_3c8.data._M_elems[1] = 0;
        local_3c8.data._M_elems[2] = 0;
        local_3c8.data._M_elems[3] = 0;
        local_3c8.data._M_elems[4] = 0;
        local_3c8.data._M_elems[5] = 0;
        local_3c8.data._M_elems._24_5_ = 0;
        local_3c8.data._M_elems[7]._1_3_ = 0;
        local_3c8.data._M_elems._32_5_ = 0;
        local_3c8.data._M_elems[9]._1_3_ = 0;
        local_3c8.exp = 0;
        local_3c8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (&local_3c8,&local_3d8,&local_328);
        local_248.m_backend.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
        local_248.m_backend.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
        local_378.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
        local_378.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
        local_248.m_backend.data._M_elems[7]._1_3_ = local_3c8.data._M_elems[7]._1_3_;
        local_248.m_backend.data._M_elems._24_5_ = local_3c8.data._M_elems._24_5_;
        local_378.data._M_elems[4] = local_3c8.data._M_elems[4];
        local_378.data._M_elems[5] = local_3c8.data._M_elems[5];
        local_378.data._M_elems[6] = local_3c8.data._M_elems[6];
        local_378.data._M_elems[7] = local_248.m_backend.data._M_elems[7];
        local_378.data._M_elems[0] = local_3c8.data._M_elems[0];
        local_378.data._M_elems[1] = local_3c8.data._M_elems[1];
        local_378.data._M_elems[2] = local_3c8.data._M_elems[2];
        local_378.data._M_elems[3] = local_3c8.data._M_elems[3];
        local_378.exp = local_3c8.exp;
        local_378.neg = local_3c8.neg;
        local_248.m_backend.fpclass = local_3c8.fpclass;
        local_248.m_backend.prec_elem = local_3c8.prec_elem;
        local_378.fpclass = local_3c8.fpclass;
        local_378.prec_elem = local_3c8.prec_elem;
        local_248.m_backend.data._M_elems[0] = local_3c8.data._M_elems[0];
        local_248.m_backend.data._M_elems[1] = local_3c8.data._M_elems[1];
        local_248.m_backend.data._M_elems[2] = local_3c8.data._M_elems[2];
        local_248.m_backend.data._M_elems[3] = local_3c8.data._M_elems[3];
        local_248.m_backend.data._M_elems[4] = local_3c8.data._M_elems[4];
        local_248.m_backend.data._M_elems[5] = local_3c8.data._M_elems[5];
        local_248.m_backend.exp = local_3c8.exp;
        local_248.m_backend.neg = local_3c8.neg;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)&local_188,&local_248);
      }
      local_2e8.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
      local_2e8.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
      local_2e8.data._M_elems[4] = local_418.data._M_elems[4];
      local_2e8.data._M_elems[5] = local_418.data._M_elems[5];
      local_2e8.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_418.data._M_elems[7],local_418.data._M_elems[6]),0);
      local_2e8.data._M_elems[7]._1_3_ = (undefined3)(local_418.data._M_elems[7] >> 8);
      local_2e8.data._M_elems[0] = local_418.data._M_elems[0];
      local_2e8.data._M_elems[1] = local_418.data._M_elems[1];
      local_2e8.data._M_elems[2] = local_418.data._M_elems[2];
      local_2e8.data._M_elems[3] = local_418.data._M_elems[3];
      local_2e8.exp = local_418.exp;
      local_2e8.neg = local_418.neg;
      local_2e8.fpclass = local_418.fpclass;
      local_2e8.prec_elem = local_418.prec_elem;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_188);
      uVar4 = local_384;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_138);
      local_3d8 = 1.0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_328,i,(type *)0x0);
      local_3c8.fpclass = cpp_dec_float_finite;
      local_3c8.prec_elem = 10;
      local_3c8.data._M_elems[0] = 0;
      local_3c8.data._M_elems[1] = 0;
      local_3c8.data._M_elems[2] = 0;
      local_3c8.data._M_elems[3] = 0;
      local_3c8.data._M_elems[4] = 0;
      local_3c8.data._M_elems[5] = 0;
      local_3c8.data._M_elems._24_5_ = 0;
      local_3c8.data._M_elems[7]._1_3_ = 0;
      local_3c8.data._M_elems._32_5_ = 0;
      local_3c8.data._M_elems[9]._1_3_ = 0;
      local_3c8.exp = 0;
      local_3c8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                (&local_3c8,&local_3d8,&local_328);
      local_418.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
      local_418.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
      local_418.data._M_elems[4] = local_3c8.data._M_elems[4];
      local_418.data._M_elems[5] = local_3c8.data._M_elems[5];
      local_418.data._M_elems[6] = local_3c8.data._M_elems[6];
      local_418.data._M_elems[7] =
           (uint)(CONCAT35(local_3c8.data._M_elems[7]._1_3_,local_3c8.data._M_elems._24_5_) >> 0x20)
      ;
      local_418.data._M_elems[0] = local_3c8.data._M_elems[0];
      local_418.data._M_elems[1] = local_3c8.data._M_elems[1];
      local_418.data._M_elems[2] = local_3c8.data._M_elems[2];
      local_418.data._M_elems[3] = local_3c8.data._M_elems[3];
      local_418.exp = local_3c8.exp;
      local_418.neg = local_3c8.neg;
      local_418.fpclass = local_3c8.fpclass;
      local_418.prec_elem = local_3c8.prec_elem;
      for (iVar2 = 0; p_dim != iVar2; iVar2 = iVar2 + 1) {
        local_208.m_backend.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
        local_208.m_backend.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
        local_208.m_backend.data._M_elems[7] = local_418.data._M_elems[7];
        local_208.m_backend.data._M_elems[6] = local_418.data._M_elems[6];
        local_208.m_backend.data._M_elems[4] = local_418.data._M_elems[4];
        local_208.m_backend.data._M_elems[5] = local_418.data._M_elems[5];
        local_208.m_backend.data._M_elems[0] = local_418.data._M_elems[0];
        local_208.m_backend.data._M_elems[1] = local_418.data._M_elems[1];
        local_208.m_backend.data._M_elems[2] = local_418.data._M_elems[2];
        local_208.m_backend.data._M_elems[3] = local_418.data._M_elems[3];
        local_208.m_backend.exp = local_418.exp;
        local_208.m_backend.neg = local_418.neg;
        local_208.m_backend.fpclass = local_418.fpclass;
        local_208.m_backend.prec_elem = local_418.prec_elem;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_188,iVar2,&local_208);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_138,&local_188);
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        local_378.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
        local_378.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
        local_378.data._M_elems[4] = local_418.data._M_elems[4];
        local_378.data._M_elems[5] = local_418.data._M_elems[5];
        local_378.data._M_elems[6] = local_418.data._M_elems[6];
        local_378.data._M_elems[7] = local_418.data._M_elems[7];
        local_378.data._M_elems[0] = local_418.data._M_elems[0];
        local_378.data._M_elems[1] = local_418.data._M_elems[1];
        local_378.data._M_elems[2] = local_418.data._M_elems[2];
        local_378.data._M_elems[3] = local_418.data._M_elems[3];
        local_378.exp = local_418.exp;
        local_378.neg = local_418.neg;
        local_378.fpclass = local_418.fpclass;
        local_378.prec_elem = local_418.prec_elem;
        (*local_380->factor->_vptr_SLinSolver[0xd])(local_380->factor,&local_188,&local_138);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(&local_188);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_3c8,&local_188);
        local_418.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
        local_418.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
        local_418.data._M_elems[4] = local_3c8.data._M_elems[4];
        local_418.data._M_elems[5] = local_3c8.data._M_elems[5];
        local_418.data._M_elems[6] = local_3c8.data._M_elems[6];
        local_418.data._M_elems[7] =
             (uint)(CONCAT35(local_3c8.data._M_elems[7]._1_3_,local_3c8.data._M_elems._24_5_) >>
                   0x20);
        local_418.data._M_elems[0] = local_3c8.data._M_elems[0];
        local_418.data._M_elems[1] = local_3c8.data._M_elems[1];
        local_418.data._M_elems[2] = local_3c8.data._M_elems[2];
        local_418.data._M_elems[3] = local_3c8.data._M_elems[3];
        local_418.exp = local_3c8.exp;
        local_418.neg = local_3c8.neg;
        local_418.fpclass = local_3c8.fpclass;
        local_418.prec_elem = local_3c8.prec_elem;
        if (2 < uVar3) {
          local_e8.fpclass = cpp_dec_float_finite;
          local_e8.prec_elem = 10;
          local_e8.data._M_elems[0] = 0;
          local_e8.data._M_elems[1] = 0;
          local_e8.data._M_elems[2] = 0;
          local_e8.data._M_elems[3] = 0;
          local_e8.data._M_elems[4] = 0;
          local_e8.data._M_elems[5] = 0;
          local_e8.data._M_elems._24_5_ = 0;
          local_e8.data._M_elems[7]._1_3_ = 0;
          local_e8.data._M_elems._32_5_ = 0;
          local_e8._37_8_ = 0;
          local_3cc = uVar3;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_e8,&local_418,&local_378);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&local_3c8,(multiprecision *)&local_e8,arg_00);
          local_328.fpclass = cpp_dec_float_finite;
          local_328.prec_elem = 10;
          local_328.data._M_elems[0] = 0;
          local_328.data._M_elems[1] = 0;
          local_328.data._M_elems[2] = 0;
          local_328.data._M_elems[3] = 0;
          local_328.data._M_elems[4] = 0;
          local_328.data._M_elems[5] = 0;
          local_328.data._M_elems._24_5_ = 0;
          local_328.data._M_elems[7]._1_3_ = 0;
          local_328.data._M_elems._32_5_ = 0;
          local_328._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_328,local_330,&local_418);
          tVar1 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3c8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_328);
          uVar3 = local_3cc;
          if (tVar1) break;
        }
        (*local_380->factor->_vptr_SLinSolver[0x15])(local_380->factor,&local_138,&local_188);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(&local_138);
        local_3d8 = 1.0;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_328,&local_138);
        local_3c8.fpclass = cpp_dec_float_finite;
        local_3c8.prec_elem = 10;
        local_3c8.data._M_elems[0] = 0;
        local_3c8.data._M_elems[1] = 0;
        local_3c8.data._M_elems[2] = 0;
        local_3c8.data._M_elems[3] = 0;
        local_3c8.data._M_elems[4] = 0;
        local_3c8.data._M_elems[5] = 0;
        local_3c8.data._M_elems._24_5_ = 0;
        local_3c8.data._M_elems[7]._1_3_ = 0;
        local_3c8.data._M_elems._32_5_ = 0;
        local_3c8.data._M_elems[9]._1_3_ = 0;
        local_3c8.exp = 0;
        local_3c8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (&local_3c8,&local_3d8,&local_328);
        local_288.m_backend.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
        local_288.m_backend.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
        local_378.data._M_elems._32_5_ = local_3c8.data._M_elems._32_5_;
        local_378.data._M_elems[9]._1_3_ = local_3c8.data._M_elems[9]._1_3_;
        local_288.m_backend.data._M_elems[7]._1_3_ = local_3c8.data._M_elems[7]._1_3_;
        local_288.m_backend.data._M_elems._24_5_ = local_3c8.data._M_elems._24_5_;
        local_378.data._M_elems[4] = local_3c8.data._M_elems[4];
        local_378.data._M_elems[5] = local_3c8.data._M_elems[5];
        local_378.data._M_elems[6] = local_3c8.data._M_elems[6];
        local_378.data._M_elems[7] = local_288.m_backend.data._M_elems[7];
        local_378.data._M_elems[0] = local_3c8.data._M_elems[0];
        local_378.data._M_elems[1] = local_3c8.data._M_elems[1];
        local_378.data._M_elems[2] = local_3c8.data._M_elems[2];
        local_378.data._M_elems[3] = local_3c8.data._M_elems[3];
        local_378.exp = local_3c8.exp;
        local_378.neg = local_3c8.neg;
        local_288.m_backend.fpclass = local_3c8.fpclass;
        local_288.m_backend.prec_elem = local_3c8.prec_elem;
        local_378.fpclass = local_3c8.fpclass;
        local_378.prec_elem = local_3c8.prec_elem;
        local_288.m_backend.data._M_elems[0] = local_3c8.data._M_elems[0];
        local_288.m_backend.data._M_elems[1] = local_3c8.data._M_elems[1];
        local_288.m_backend.data._M_elems[2] = local_3c8.data._M_elems[2];
        local_288.m_backend.data._M_elems[3] = local_3c8.data._M_elems[3];
        local_288.m_backend.data._M_elems[4] = local_3c8.data._M_elems[4];
        local_288.m_backend.data._M_elems[5] = local_3c8.data._M_elems[5];
        local_288.m_backend.exp = local_3c8.exp;
        local_288.m_backend.neg = local_3c8.neg;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)&local_138,&local_288);
      }
      local_68.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
      local_68.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
      local_68.data._M_elems[4] = local_418.data._M_elems[4];
      local_68.data._M_elems[5] = local_418.data._M_elems[5];
      local_68.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_418.data._M_elems[7],local_418.data._M_elems[6]),0);
      local_68.data._M_elems[7]._1_3_ = (undefined3)(local_418.data._M_elems[7] >> 8);
      local_68.data._M_elems[0] = local_418.data._M_elems[0];
      local_68.data._M_elems[1] = local_418.data._M_elems[1];
      local_68.data._M_elems[2] = local_418.data._M_elems[2];
      local_68.data._M_elems[3] = local_418.data._M_elems[3];
      local_68.exp = local_418.exp;
      local_68.neg = local_418.neg;
      local_68.fpclass = local_418.fpclass;
      local_68.prec_elem = local_418.prec_elem;
      local_338->fpclass = cpp_dec_float_finite;
      local_338->prec_elem = 10;
      (local_338->data)._M_elems[0] = 0;
      (local_338->data)._M_elems[1] = 0;
      (local_338->data)._M_elems[2] = 0;
      (local_338->data)._M_elems[3] = 0;
      (local_338->data)._M_elems[4] = 0;
      (local_338->data)._M_elems[5] = 0;
      (local_338->data)._M_elems[6] = 0;
      (local_338->data)._M_elems[7] = 0;
      *(undefined8 *)((long)(local_338->data)._M_elems + 0x1d) = 0;
      *(undefined8 *)((long)(local_338->data)._M_elems + 0x25) = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (local_338,&local_2e8,&local_68);
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_138);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_188);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_338;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}